

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.c
# Opt level: O2

int main(int argc,char **argv)

{
  uchar *puVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uchar *puVar8;
  size_t sVar9;
  uint *puVar10;
  uchar *address;
  ulong uVar11;
  int family;
  int family_00;
  int sock;
  int sock_00;
  int family_01;
  int family_02;
  int sock_01;
  int sock_02;
  FILE *pFVar12;
  char *pcVar13;
  undefined8 uStack_f0;
  uchar *buf2;
  uchar *buf1;
  nn_iovec iov;
  nn_iovec *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char socket_address_tcp [128];
  
  if (argc < 2) {
    pcVar13 = "5555";
  }
  else {
    pcVar13 = argv[1];
  }
  uVar3 = atoi(pcVar13);
  iVar5 = 0x1021cd;
  pcVar13 = "127.0.0.1";
  sprintf(socket_address_tcp,"%s://%s:%d","tcp","127.0.0.1",(ulong)uVar3);
  iVar4 = test_socket_impl((char *)0x32,iVar5,family,(int)pcVar13);
  iVar5 = iVar4;
  test_bind_impl((char *)0x33,iVar4,0x10210c,pcVar13);
  iVar5 = test_socket_impl((char *)0x34,iVar5,family_00,(int)pcVar13);
  test_connect_impl((char *)0x35,iVar5,0x10210c,pcVar13);
  buf1 = (uchar *)nn_allocmsg(0x100,0);
  if (buf1 == (uchar *)0x0) {
    nn_backtrace_print();
    uStack_f0 = 0x38;
LAB_00101b65:
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
            uStack_f0);
    goto LAB_00101746;
  }
  for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
    buf1[lVar7] = (uchar)lVar7;
  }
  iVar6 = nn_send(iVar5,&buf1,0xffffffffffffffff);
  if (iVar6 < 0) {
    nn_backtrace_print();
    pFVar12 = _stderr;
    puVar10 = (uint *)__errno_location();
    pcVar13 = nn_err_strerror(*puVar10);
    uVar11 = (ulong)*puVar10;
    uStack_f0 = 0x3c;
LAB_00101b2c:
    fprintf(pFVar12,"%s [%d] (%s:%d)\n",pcVar13,uVar11,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
            uStack_f0);
  }
  else {
    if (iVar6 == 0x100) {
      buf2 = (uchar *)0x0;
      address = (uchar *)0x0;
      iVar6 = nn_recv(iVar4,&buf2,0xffffffffffffffff);
      if (iVar6 < 0) {
        nn_backtrace_print();
        pFVar12 = _stderr;
        puVar10 = (uint *)__errno_location();
        pcVar13 = nn_err_strerror(*puVar10);
        uVar11 = (ulong)*puVar10;
        uStack_f0 = 0x41;
        goto LAB_00101b2c;
      }
      if (iVar6 == 0x100) {
        if (buf2 != (uchar *)0x0) {
          puVar8 = (uchar *)0x0;
LAB_001014b1:
          if (puVar8 != (uchar *)0x100) goto code_r0x001014b9;
          iVar6 = nn_freemsg();
          if (iVar6 != 0) {
            nn_backtrace_print();
            pFVar12 = _stderr;
            puVar10 = (uint *)__errno_location();
            pcVar13 = nn_err_strerror(*puVar10);
            uVar11 = (ulong)*puVar10;
            uStack_f0 = 0x47;
            goto LAB_00101b2c;
          }
          buf1 = (uchar *)nn_allocmsg(0x100,0);
          if (buf1 != (uchar *)0x0) {
            for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
              buf1[lVar7] = (uchar)lVar7;
              address = buf1;
            }
            iov.iov_len = 0xffffffffffffffff;
            local_b0 = 0;
            uStack_b8 = 0;
            local_c0 = 1;
            iov.iov_base = &buf1;
            local_c8 = &iov;
            iVar6 = nn_sendmsg(iVar5,&local_c8,0);
            if (iVar6 < 0) {
              nn_backtrace_print();
              pFVar12 = _stderr;
              puVar10 = (uint *)__errno_location();
              pcVar13 = nn_err_strerror(*puVar10);
              uVar11 = (ulong)*puVar10;
              uStack_f0 = 0x53;
              goto LAB_00101b2c;
            }
            if (iVar6 != 0x100) {
              nn_backtrace_print();
              pcVar13 = "rc == 256";
              uStack_f0 = 0x54;
              goto LAB_0010173c;
            }
            buf2 = (uchar *)0x0;
            iov.iov_len = 0xffffffffffffffff;
            local_b0 = 0;
            uStack_b8 = 0;
            local_c0 = 1;
            iov.iov_base = &buf2;
            local_c8 = &iov;
            iVar6 = nn_recvmsg(iVar4,&local_c8,0);
            if (iVar6 < 0) {
              nn_backtrace_print();
              pFVar12 = _stderr;
              puVar10 = (uint *)__errno_location();
              pcVar13 = nn_err_strerror(*puVar10);
              uVar11 = (ulong)*puVar10;
              uStack_f0 = 0x5d;
              goto LAB_00101b2c;
            }
            if (iVar6 == 0x100) {
              if (buf2 == (uchar *)0x0) {
                nn_backtrace_print();
                pcVar13 = "buf2";
                uStack_f0 = 0x5f;
                goto LAB_0010173c;
              }
              puVar8 = (uchar *)0x0;
              while (puVar8 != (uchar *)0x100) {
                address = puVar8 + 1;
                puVar1 = buf2 + (long)puVar8;
                puVar8 = address;
                if ((uchar)((char)address + 0xff) != *puVar1) {
                  nn_backtrace_print();
                  pcVar13 = "buf2 [i] == (unsigned char) i";
                  uStack_f0 = 0x61;
                  goto LAB_0010173c;
                }
              }
              iVar6 = nn_freemsg();
              if (iVar6 != 0) {
                nn_backtrace_print();
                pFVar12 = _stderr;
                puVar10 = (uint *)__errno_location();
                pcVar13 = nn_err_strerror(*puVar10);
                uVar11 = (ulong)*puVar10;
                uStack_f0 = 99;
                goto LAB_00101b2c;
              }
              test_close_impl((char *)0x65,iVar5,sock);
              test_close_impl((char *)0x66,iVar4,sock_00);
              iVar4 = test_socket_impl((char *)0x6a,iVar4,family_01,(int)address);
              iVar5 = iVar4;
              test_bind_impl((char *)0x6b,iVar4,(int)socket_address_tcp,(char *)address);
              iVar5 = test_socket_impl((char *)0x6c,iVar5,family_02,(int)address);
              test_connect_impl((char *)0x6d,iVar5,(int)socket_address_tcp,(char *)address);
              for (uVar11 = 0; uVar11 != 0x100000; uVar11 = uVar11 + 1) {
                longdata[uVar11] = (char)((uVar11 & 0xffffffff) / 10) * -10 + '0' + (char)uVar11;
              }
              longdata[0xfffff] = '\0';
              sVar9 = strlen(longdata);
              uVar3 = nn_send(iVar4,longdata,sVar9,0);
              pFVar12 = _stderr;
              if ((int)uVar3 < 0) {
                puVar10 = (uint *)__errno_location();
                pcVar13 = nn_err_strerror(*puVar10);
                fprintf(pFVar12,"Failed to send: %s [%d] (%s:%d)\n",pcVar13,(ulong)*puVar10,
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                        ,0x72);
                nn_err_abort();
              }
              if (uVar3 != (uint)sVar9) {
                fprintf(_stderr,"Data to send is truncated: %d != %d (%s:%d)\n",(ulong)uVar3,
                        sVar9 & 0xffffffff,
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                        ,0x72);
                nn_err_abort();
              }
              iVar6 = nn_recv(iVar5,&buf2,0xffffffffffffffff,0);
              if (iVar6 < 0) {
                nn_backtrace_print();
                pFVar12 = _stderr;
                puVar10 = (uint *)__errno_location();
                pcVar13 = nn_err_strerror(*puVar10);
                uVar11 = (ulong)*puVar10;
                uStack_f0 = 0x75;
                goto LAB_00101b2c;
              }
              if (iVar6 != 0xfffff) {
                nn_backtrace_print();
                pcVar13 = "rc == sizeof (longdata) - 1";
                uStack_f0 = 0x76;
                goto LAB_0010173c;
              }
              if (buf2 == (uchar *)0x0) {
                nn_backtrace_print();
                pcVar13 = "buf2";
                uStack_f0 = 0x77;
                goto LAB_0010173c;
              }
              lVar7 = 0;
              while (lVar7 != 0xfffff) {
                pbVar2 = buf2 + lVar7;
                pcVar13 = longdata + lVar7;
                lVar7 = lVar7 + 1;
                if ((uint)*pbVar2 != (int)*pcVar13) {
                  nn_backtrace_print();
                  pcVar13 = "buf2 [i] == longdata [i]";
                  uStack_f0 = 0x79;
                  goto LAB_0010173c;
                }
              }
              iVar6 = nn_freemsg();
              if (iVar6 != 0) {
                nn_backtrace_print();
                pFVar12 = _stderr;
                puVar10 = (uint *)__errno_location();
                pcVar13 = nn_err_strerror(*puVar10);
                uVar11 = (ulong)*puVar10;
                uStack_f0 = 0x7b;
                goto LAB_00101b2c;
              }
              test_close_impl((char *)0x7d,iVar5,sock_01);
              test_close_impl((char *)0x7e,iVar4,sock_02);
              buf1 = (uchar *)nn_allocmsg(8,0);
              if (buf1 != (uchar *)0x0) {
                buf2 = (uchar *)nn_reallocmsg(buf1,1);
                if (buf2 == buf1) {
                  buf1 = (uchar *)nn_reallocmsg(buf2,100);
                  if (buf1 == buf2) {
                    nn_backtrace_print();
                    pcVar13 = "buf1 != buf2";
                    uStack_f0 = 0x8a;
                  }
                  else {
                    if (buf1 != (uchar *)0x0) {
                      nn_freemsg(buf1);
                      return 0;
                    }
                    nn_backtrace_print();
                    pcVar13 = "buf1 != 0";
                    uStack_f0 = 0x8b;
                  }
                }
                else {
                  nn_backtrace_print();
                  pcVar13 = "buf2 == buf1";
                  uStack_f0 = 0x87;
                }
                goto LAB_0010173c;
              }
              nn_backtrace_print();
              uStack_f0 = 0x83;
              goto LAB_00101b65;
            }
            nn_backtrace_print();
            pcVar13 = "rc == 256";
            uStack_f0 = 0x5e;
            goto LAB_0010173c;
          }
          nn_backtrace_print();
          uStack_f0 = 0x4a;
          goto LAB_00101b65;
        }
        nn_backtrace_print();
        pcVar13 = "buf2";
        uStack_f0 = 0x43;
      }
      else {
        nn_backtrace_print();
        pcVar13 = "rc == 256";
        uStack_f0 = 0x42;
      }
    }
    else {
      nn_backtrace_print();
      pcVar13 = "rc == 256";
      uStack_f0 = 0x3d;
    }
LAB_0010173c:
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar13,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
            uStack_f0);
  }
LAB_00101746:
  fflush(_stderr);
  nn_err_abort();
code_r0x001014b9:
  address = puVar8 + 1;
  puVar1 = buf2 + (long)puVar8;
  puVar8 = address;
  if ((uchar)((char)address + 0xff) != *puVar1) goto code_r0x001014c8;
  goto LAB_001014b1;
code_r0x001014c8:
  nn_backtrace_print();
  pcVar13 = "buf2 [i] == (unsigned char) i";
  uStack_f0 = 0x45;
  goto LAB_0010173c;
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    unsigned char *buf1, *buf2;
    int i;
    struct nn_iovec iov;
    struct nn_msghdr hdr;
    char socket_address_tcp[128];

    test_addr_from(socket_address_tcp, "tcp", "127.0.0.1",
            get_test_port(argc, argv));

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    rc = nn_send (sc, &buf1, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    rc = nn_recv (sb, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    iov.iov_base = &buf1;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_sendmsg (sc, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    iov.iov_base = &buf2;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_recvmsg (sb, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);

    /*  Test receiving of large message  */

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address_tcp);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address_tcp);

    for (i = 0; i < (int) sizeof (longdata); ++i)
        longdata[i] = '0' + (i % 10);
    longdata [sizeof (longdata) - 1] = 0;
    test_send (sb, longdata);

    rc = nn_recv (sc, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == sizeof (longdata) - 1);
    nn_assert (buf2);
    for (i = 0; i < (int) sizeof (longdata) - 1; ++i)
        nn_assert (buf2 [i] == longdata [i]);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);


    /*  Test reallocmsg  */
    buf1 = nn_allocmsg (8, 0);
    alloc_assert (buf1);

    buf2 = nn_reallocmsg (buf1, 1);

    nn_assert (buf2 == buf1);

    buf1 = nn_reallocmsg (buf2, 100);
    nn_assert (buf1 != buf2);
    nn_assert (buf1 != 0);

    nn_freemsg (buf1);

    return 0;
}